

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::ImageTestCase::ImageTestCase
          (ImageTestCase *this,EglTestContext *eglTestCtx,ApiType api,string *name,string *desc)

{
  egl::TestCase::TestCase
            (&this->super_TestCase,eglTestCtx,(name->_M_dataplus)._M_p,(desc->_M_dataplus)._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTestCase_01e0eb48;
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,&this->m_gl,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTestCase_01e0eb48;
  glw::Functions::Functions(&this->m_gl);
  (this->m_api).m_bits = api.m_bits;
  this->m_display = (EGLDisplay)0x0;
  return;
}

Assistant:

ImageTestCase		(EglTestContext& eglTestCtx, ApiType api, const string& name, const string& desc)
					: TestCase				(eglTestCtx, name.c_str(), desc.c_str())
					, glu::CallLogWrapper	(m_gl, m_testCtx.getLog())
					, m_api					(api)
					, m_display				(EGL_NO_DISPLAY)
	{
	}